

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFEmitter.cpp
# Opt level: O3

void llvm::DWARFYAML::EmitDebugLoc(raw_ostream *OS,Data *DI)

{
  undefined4 uVar1;
  pointer pLVar2;
  undefined4 uVar3;
  uint uVar4;
  undefined1 *puVar5;
  ushort uVar6;
  uint uVar7;
  size_t __n;
  ulong Size;
  undefined1 *puVar8;
  pointer pLVar9;
  int local_68;
  int iStack_64;
  Loc Loc;
  undefined2 local_32;
  
  pLVar9 = (DI->Locs).
           super__Vector_base<llvm::DWARFYAML::Loc,_std::allocator<llvm::DWARFYAML::Loc>_>._M_impl.
           super__Vector_impl_data._M_start;
  pLVar2 = (DI->Locs).
           super__Vector_base<llvm::DWARFYAML::Loc,_std::allocator<llvm::DWARFYAML::Loc>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pLVar9 != pLVar2) {
    Loc.CompileUnitOffset = (uint64_t)DI;
    do {
      uVar1 = pLVar9->Start;
      uVar3 = pLVar9->End;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&Loc,&pLVar9->Location);
      Loc.Location.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)pLVar9->CompileUnitOffset;
      Size = (ulong)((DI->CompileUnits).
                     super__Vector_base<llvm::DWARFYAML::Unit,_std::allocator<llvm::DWARFYAML::Unit>_>
                     ._M_impl.super__Vector_impl_data._M_start)->AddrSize;
      writeVariableSizedInteger((long)(int)uVar1,Size,OS,DI->IsLittleEndian);
      writeVariableSizedInteger((long)(int)uVar3,Size,OS,DI->IsLittleEndian);
      if ((uVar1 != -1) && (uVar3 != 0 || uVar1 != 0)) {
        uVar7 = (int)Loc.Location.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start - Loc.Start;
        uVar4 = CONCAT22((short)(uVar7 >> 0x10),(ushort)uVar7 << 8 | (ushort)uVar7 >> 8);
        if (DI->IsLittleEndian != false) {
          uVar4 = uVar7;
        }
        __n = (size_t)uVar4;
        local_32 = (undefined2)uVar4;
        raw_ostream::write(OS,(int)&local_32,(void *)0x2,__n);
        puVar5 = (undefined1 *)
                 CONCAT44(Loc.Location.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start._4_4_,
                          (int)Loc.Location.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start);
        DI = (Data *)Loc.CompileUnitOffset;
        for (puVar8 = (undefined1 *)Loc._0_8_; Loc.CompileUnitOffset = (uint64_t)DI,
            puVar8 != puVar5; puVar8 = puVar8 + 1) {
          uVar6 = (ushort)local_32 >> 8;
          local_32 = CONCAT11((char)uVar6,*puVar8);
          raw_ostream::write(OS,(int)&local_32,(void *)0x1,__n);
          DI = (Data *)Loc.CompileUnitOffset;
        }
      }
      if (Loc._0_8_ != 0) {
        operator_delete((void *)Loc._0_8_,
                        (long)Loc.Location.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish - Loc._0_8_);
      }
      pLVar9 = pLVar9 + 1;
    } while (pLVar9 != pLVar2);
  }
  return;
}

Assistant:

void DWARFYAML::EmitDebugLoc(raw_ostream &OS, const DWARFYAML::Data &DI) {
  for (auto Loc : DI.Locs) {
    auto AddrSize = DI.CompileUnits[0].AddrSize;  // XXX BINARYEN
    // FIXME: Loc.Start etc should probably not be 32-bit.
    writeVariableSizedInteger((uint64_t)(int32_t)Loc.Start, AddrSize, OS, DI.IsLittleEndian);
    writeVariableSizedInteger((uint64_t)(int32_t)Loc.End, AddrSize, OS, DI.IsLittleEndian);
    if (Loc.Start == 0 && Loc.End == 0) {
      // End of a list.
      continue;
    }
    if (Loc.Start != -1) {
      writeInteger((uint16_t)Loc.Location.size(), OS, DI.IsLittleEndian);
      for (auto x : Loc.Location) {
        writeInteger((uint8_t)x, OS, DI.IsLittleEndian);
      }
    }
  }
}